

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::Hashing::compute_hash_render_pass2
               (VkRenderPassCreateInfo2 *create_info,Hash *out_hash)

{
  VkAttachmentDescription2 *pVVar1;
  VkSubpassDependency2 *pVVar2;
  VkSubpassDescription2 *pVVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  Hasher local_48;
  ulong local_40;
  ulong *local_38;
  
  uVar5 = create_info->dependencyCount;
  local_48.h = ((((((ulong)create_info->flags ^ 0xaf63bd4c8601b7df) * 0x100000001b3 ^
                  (ulong)create_info->attachmentCount) * 0x100000001b3 ^ (ulong)uVar5) *
                 0x100000001b3 ^ (ulong)create_info->subpassCount) * 0x100000001b3 ^
               (ulong)create_info->correlatedViewMaskCount) * 0x100000001b3 ^ 2;
  local_38 = out_hash;
  if ((ulong)create_info->attachmentCount != 0) {
    lVar8 = 0x30;
    uVar7 = 0;
    do {
      pVVar1 = create_info->pAttachments;
      local_48.h = ((((((((local_48.h * 0x100000001b3 ^
                          (ulong)*(uint *)((long)pVVar1 + lVar8 + -0x20)) * 0x100000001b3 ^
                         (ulong)*(uint *)((long)pVVar1 + lVar8 + -4)) * 0x100000001b3 ^
                        (ulong)*(uint *)((long)&pVVar1->sType + lVar8)) * 0x100000001b3 ^
                       (ulong)*(uint *)((long)pVVar1 + lVar8 + -0x1c)) * 0x100000001b3 ^
                      (ulong)*(uint *)((long)pVVar1 + lVar8 + -0x14)) * 0x100000001b3 ^
                     (ulong)*(uint *)((long)pVVar1 + lVar8 + -0x10)) * 0x100000001b3 ^
                    (ulong)*(uint *)((long)pVVar1 + lVar8 + -0xc)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)pVVar1 + lVar8 + -8)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)pVVar1 + lVar8 + -0x18);
      bVar4 = hash_pnext_chain((StateRecorder *)0x0,&local_48,
                               *(void **)((long)pVVar1 + lVar8 + -0x28),(DynamicStateInfo *)0x0,0);
      if (!bVar4) {
        return false;
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x38;
    } while (uVar7 < create_info->attachmentCount);
    uVar5 = create_info->dependencyCount;
  }
  if (uVar5 != 0) {
    lVar8 = 0x2c;
    uVar7 = 0;
    do {
      pVVar2 = create_info->pDependencies;
      local_48.h = (((((((local_48.h * 0x100000001b3 ^ (ulong)*(uint *)((long)pVVar2 + lVar8 + -4))
                         * 0x100000001b3 ^ (ulong)*(uint *)((long)pVVar2 + lVar8 + -8)) *
                        0x100000001b3 ^ (ulong)*(uint *)((long)pVVar2 + lVar8 + -0xc)) *
                       0x100000001b3 ^ (ulong)*(uint *)((long)pVVar2 + lVar8 + -0x1c)) *
                      0x100000001b3 ^ (ulong)*(uint *)((long)pVVar2 + lVar8 + -0x18)) *
                     0x100000001b3 ^ (ulong)*(uint *)((long)pVVar2 + lVar8 + -0x14)) * 0x100000001b3
                   ^ (ulong)*(uint *)((long)pVVar2 + lVar8 + -0x10)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)&pVVar2->sType + lVar8);
      bVar4 = hash_pnext_chain((StateRecorder *)0x0,&local_48,
                               *(void **)((long)pVVar2 + lVar8 + -0x24),(DynamicStateInfo *)0x0,0);
      if (!bVar4) {
        return false;
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x30;
    } while (uVar7 < create_info->dependencyCount);
  }
  if (create_info->subpassCount != 0) {
    uVar7 = 0;
    do {
      pVVar3 = create_info->pSubpasses;
      uVar5 = pVVar3[uVar7].inputAttachmentCount;
      uVar9 = (ulong)pVVar3[uVar7].preserveAttachmentCount;
      local_48.h = ((((local_48.h * 0x100000001b3 ^ (ulong)pVVar3[uVar7].flags) * 0x100000001b3 ^
                     (ulong)pVVar3[uVar7].colorAttachmentCount) * 0x100000001b3 ^ (ulong)uVar5) *
                    0x100000001b3 ^ uVar9) * 0x100000001b3 ^ (ulong)pVVar3[uVar7].pipelineBindPoint;
      if (uVar9 != 0) {
        uVar10 = 0;
        do {
          local_48.h = local_48.h * 0x100000001b3 ^
                       (ulong)pVVar3[uVar7].pPreserveAttachments[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      local_40 = uVar7;
      if (pVVar3[uVar7].colorAttachmentCount == 0) {
        uVar6 = 0;
      }
      else {
        lVar8 = 0;
        uVar9 = 0;
        do {
          bVar4 = hash_reference_base(&local_48,
                                      (VkAttachmentReference2 *)
                                      ((long)&(pVVar3[uVar7].pColorAttachments)->sType + lVar8));
          if (!bVar4) {
            return false;
          }
          uVar9 = uVar9 + 1;
          uVar6 = pVVar3[uVar7].colorAttachmentCount;
          lVar8 = lVar8 + 0x20;
        } while (uVar9 < uVar6);
        uVar5 = pVVar3[uVar7].inputAttachmentCount;
      }
      if (uVar5 != 0) {
        lVar8 = 0;
        uVar9 = 0;
        do {
          bVar4 = hash_reference_base(&local_48,
                                      (VkAttachmentReference2 *)
                                      ((long)&(pVVar3[uVar7].pInputAttachments)->sType + lVar8));
          if (!bVar4) {
            return false;
          }
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 0x20;
        } while (uVar9 < pVVar3[uVar7].inputAttachmentCount);
        uVar6 = pVVar3[uVar7].colorAttachmentCount;
      }
      if ((pVVar3[uVar7].pResolveAttachments != (VkAttachmentReference2 *)0x0) && (uVar6 != 0)) {
        lVar8 = 0;
        uVar9 = 0;
        do {
          bVar4 = hash_reference_base(&local_48,
                                      (VkAttachmentReference2 *)
                                      ((long)&(pVVar3[uVar7].pResolveAttachments)->sType + lVar8));
          if (!bVar4) {
            return false;
          }
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 0x20;
        } while (uVar9 < pVVar3[uVar7].colorAttachmentCount);
      }
      if (pVVar3[uVar7].pDepthStencilAttachment == (VkAttachmentReference2 *)0x0) {
        local_48.h = local_48.h * 0x100000001b3;
      }
      else {
        bVar4 = hash_reference_base(&local_48,pVVar3[uVar7].pDepthStencilAttachment);
        if (!bVar4) {
          return false;
        }
      }
      local_48.h = local_48.h * 0x100000001b3 ^ (ulong)pVVar3[uVar7].viewMask;
      bVar4 = hash_pnext_chain((StateRecorder *)0x0,&local_48,pVVar3[uVar7].pNext,
                               (DynamicStateInfo *)0x0,0);
      if (!bVar4) {
        return false;
      }
      uVar7 = local_40 + 1;
    } while (uVar7 < create_info->subpassCount);
  }
  if ((ulong)create_info->correlatedViewMaskCount != 0) {
    uVar7 = 0;
    do {
      local_48.h = local_48.h * 0x100000001b3 ^ (ulong)create_info->pCorrelatedViewMasks[uVar7];
      uVar7 = uVar7 + 1;
    } while (create_info->correlatedViewMaskCount != uVar7);
  }
  bVar4 = hash_pnext_chain((StateRecorder *)0x0,&local_48,create_info->pNext,(DynamicStateInfo *)0x0
                           ,0);
  if (bVar4) {
    *local_38 = local_48.h;
  }
  return bVar4;
}

Assistant:

bool compute_hash_render_pass2(const VkRenderPassCreateInfo2 &create_info, Hash *out_hash)
{
	Hasher h;

	h.u32(create_info.flags);
	h.u32(create_info.attachmentCount);
	h.u32(create_info.dependencyCount);
	h.u32(create_info.subpassCount);
	h.u32(create_info.correlatedViewMaskCount);
	h.u32(2);

	for (uint32_t i = 0; i < create_info.attachmentCount; i++)
	{
		auto &att = create_info.pAttachments[i];
		if (!hash_attachment2(h, att))
			return false;
	}

	for (uint32_t i = 0; i < create_info.dependencyCount; i++)
	{
		auto &dep = create_info.pDependencies[i];
		if (!hash_dependency2(h, dep))
			return false;
	}

	for (uint32_t i = 0; i < create_info.subpassCount; i++)
	{
		auto &subpass = create_info.pSubpasses[i];
		if (!hash_subpass2(h, subpass))
			return false;
	}

	for (uint32_t i = 0; i < create_info.correlatedViewMaskCount; i++)
		h.u32(create_info.pCorrelatedViewMasks[i]);

	if (!hash_pnext_chain(nullptr, h, create_info.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}